

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void solver_started_cb(solver_parameters *params)

{
  undefined1 auVar1 [16];
  unsigned_long_long uVar2;
  size_t sVar3;
  char *pcVar4;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  init_policy_type *local_d8;
  code *local_d0;
  constraint_order *local_c8;
  code *local_c0;
  floating_point_type *local_b8;
  code *local_b0;
  double local_a8;
  mode_type *local_98;
  code *local_90;
  observer_type *local_88;
  code *local_80;
  double local_78;
  double local_68;
  double local_58;
  cost_norm_type *local_48;
  code *local_40;
  double local_38;
  
  local_d8 = (init_policy_type *)0x0;
  format_str.size_ = 0xe;
  format_str.data_ = "Solver starts\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_d8;
  fmt::v7::vprint(_stdout,format_str,(format_args)(auVar1 << 0x40));
  local_d8 = (init_policy_type *)params->limit;
  local_c8 = (constraint_order *)params->time_limit;
  local_a8 = (double)(ulong)(uint)params->print_level;
  local_b8 = &params->float_type;
  local_98 = &params->mode;
  local_88 = &params->observer;
  local_b0 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<baryonyx::solver_parameters::floating_point_type,fmt::v7::formatter<baryonyx::solver_parameters::floating_point_type,char,void>>
  ;
  local_90 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<baryonyx::solver_parameters::mode_type,fmt::v7::formatter<baryonyx::solver_parameters::mode_type,char,void>>
  ;
  local_80 = fmt::v7::detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<baryonyx::solver_parameters::observer_type,fmt::v7::formatter<baryonyx::solver_parameters::observer_type,char,void>>
  ;
  format_str_00.size_ = 0x93;
  format_str_00.data_ =
       " * Global parameters:\n  - limit: {}\n  - time-limit: {:.10g}s\n  - floating-point-type: {}\n  - print-level: {}\n  - auto-tune: {}\n  - observation: {}\n"
  ;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_d8;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xff1fa3;
  fmt::v7::vprint(_stdout,format_str_00,args);
  if (params->solver == bastert) {
    local_b8 = (floating_point_type *)params->theta;
    local_a8 = params->delta;
    local_d8 = &params->pre_order;
    local_98 = (mode_type *)params->kappa_min;
    local_88 = (observer_type *)params->kappa_step;
    local_78 = params->kappa_max;
    local_68 = params->alpha;
    local_58 = params->w;
    local_c8 = &params->order;
    local_48 = &params->cost_norm;
    local_d0 = fmt::v7::detail::
               value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
               format_custom_arg<baryonyx::solver_parameters::pre_constraint_order,fmt::v7::formatter<baryonyx::solver_parameters::pre_constraint_order,char,void>>
    ;
    local_c0 = fmt::v7::detail::
               value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
               format_custom_arg<baryonyx::solver_parameters::constraint_order,fmt::v7::formatter<baryonyx::solver_parameters::constraint_order,char,void>>
    ;
    local_40 = fmt::v7::detail::
               value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
               format_custom_arg<baryonyx::solver_parameters::cost_norm_type,fmt::v7::formatter<baryonyx::solver_parameters::cost_norm_type,char,void>>
    ;
    format_str_01.size_ = 0xc4;
    format_str_01.data_ =
         " * In The Middle parameters:\n  - preprocessing: {}\n  - constraint-order: {}\n  - theta: {:.10g}\n  - delta: {:.10g}\n  - kappa: {:.10g} {:.10g} {:.10g}\n  - alpha: {:.10g}\n  - w: {:.10g}\n  - norm: {}\n"
    ;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_d8;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 0xfaaaaaaaff;
    fmt::v7::vprint(_stdout,format_str_01,args_00);
    local_d8 = (init_policy_type *)(ulong)(uint)params->pushes_limit;
    local_a8 = params->pushing_k_factor;
    local_c8 = (constraint_order *)params->pushing_objective_amplifier;
    local_b8 = (floating_point_type *)(ulong)(uint)params->pushing_iteration_limit;
    format_str_02.size_ = 0x99;
    format_str_02.data_ =
         " * Pushes system parameters:\n  - pushes-limit: {}\n  - pushing-objective-amplifier: {:.10g}\n  - pushing-iteration-limit: {}\n  - pushing-k-factor: {:.10g}\n"
    ;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_d8;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 0xa1a1;
    fmt::v7::vprint(_stdout,format_str_02,args_01);
    local_c8 = (constraint_order *)params->init_policy_random;
    local_d8 = &params->init_policy;
    local_d0 = fmt::v7::detail::
               value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
               format_custom_arg<baryonyx::solver_parameters::init_policy_type,fmt::v7::formatter<baryonyx::solver_parameters::init_policy_type,char,void>>
    ;
    format_str_03.size_ = 0x54;
    format_str_03.data_ =
         " * Solver initialization parameters:\n  - init-policy: {}\n  - init-policy-random: {}\n";
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_d8;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 0xaf;
    fmt::v7::vprint(_stdout,format_str_03,args_02);
    local_d8 = (init_policy_type *)(ulong)(uint)params->init_population_size;
    local_c8 = (constraint_order *)params->init_crossover_bastert_insertion;
    local_b8 = (floating_point_type *)params->init_crossover_solution_selection_mean;
    local_a8 = params->init_crossover_solution_selection_stddev;
    local_98 = (mode_type *)params->init_mutation_variable_mean;
    local_88 = (observer_type *)params->init_mutation_variable_stddev;
    local_78 = params->init_mutation_value_mean;
    local_68 = params->init_mutation_value_stddev;
    local_58 = params->init_kappa_improve_start;
    local_48 = (cost_norm_type *)params->init_kappa_improve_increase;
    local_38 = params->init_kappa_improve_stop;
    pcVar4 = 
    " * Optimizer initialization parameters:\n  - init-population-size: {}\n  - init-crossover-bastert-insertion: {}\n  - init-crossover-solution-selection-mean: {}\n  - init-crossover-solution-selection-stddev: {}\n  - init-mutation-variable-mean: {}\n  - init-mutation-variable-stddev: {}\n  - init-mutation-value-mean: {}\n  - init-mutation-value-stddev: {}\n  - init-kappa-improve-start: {}\n  - init-kappa-improve-increase: {}\n  - init-kappa-improve-stop: {}\n"
    ;
    uVar2 = 0xaaaaaaaaaa1;
    sVar3 = 0x1c1;
  }
  else {
    pcVar4 = " * Random solvers:\n  - random: bernouilli with p=0.5\n";
    sVar3 = 0x35;
    uVar2 = 0;
    local_d8 = (init_policy_type *)0x0;
  }
  format_str_04.size_ = sVar3;
  format_str_04.data_ = pcVar4;
  args_03.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_d8;
  args_03.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = uVar2;
  fmt::v7::vprint(_stdout,format_str_04,args_03);
  return;
}

Assistant:

static void
solver_started_cb(const baryonyx::solver_parameters& params)
{
    fmt::print("Solver starts\n");

    fmt::print(" * Global parameters:\n"
               "  - limit: {}\n"
               "  - time-limit: {:.10g}s\n"
               "  - floating-point-type: {}\n"
               "  - print-level: {}\n"
               "  - auto-tune: {}\n"
               "  - observation: {}\n",
               params.limit,
               params.time_limit,
               params.float_type,
               params.print_level,
               params.mode,
               params.observer);

    if (params.solver == baryonyx::solver_parameters::solver_type::bastert) {
        fmt::print(" * In The Middle parameters:\n"
                   "  - preprocessing: {}\n"
                   "  - constraint-order: {}\n"
                   "  - theta: {:.10g}\n"
                   "  - delta: {:.10g}\n"
                   "  - kappa: {:.10g} {:.10g} {:.10g}\n"
                   "  - alpha: {:.10g}\n"
                   "  - w: {:.10g}\n"
                   "  - norm: {}\n",
                   params.pre_order,
                   params.order,
                   params.theta,
                   params.delta,
                   params.kappa_min,
                   params.kappa_step,
                   params.kappa_max,
                   params.alpha,
                   params.w,
                   params.cost_norm);

        fmt::print(" * Pushes system parameters:\n"
                   "  - pushes-limit: {}\n"
                   "  - pushing-objective-amplifier: {:.10g}\n"
                   "  - pushing-iteration-limit: {}\n"
                   "  - pushing-k-factor: {:.10g}\n",
                   params.pushes_limit,
                   params.pushing_objective_amplifier,
                   params.pushing_iteration_limit,
                   params.pushing_k_factor);

        fmt::print(" * Solver initialization parameters:\n"
                   "  - init-policy: {}\n"
                   "  - init-policy-random: {}\n",
                   params.init_policy,
                   params.init_policy_random);

        fmt::print(" * Optimizer initialization parameters:\n"
                   "  - init-population-size: {}\n"
                   "  - init-crossover-bastert-insertion: {}\n"
                   "  - init-crossover-solution-selection-mean: {}\n"
                   "  - init-crossover-solution-selection-stddev: {}\n"
                   "  - init-mutation-variable-mean: {}\n"
                   "  - init-mutation-variable-stddev: {}\n"
                   "  - init-mutation-value-mean: {}\n"
                   "  - init-mutation-value-stddev: {}\n"
                   "  - init-kappa-improve-start: {}\n"
                   "  - init-kappa-improve-increase: {}\n"
                   "  - init-kappa-improve-stop: {}\n",
                   params.init_population_size,
                   params.init_crossover_bastert_insertion,
                   params.init_crossover_solution_selection_mean,
                   params.init_crossover_solution_selection_stddev,
                   params.init_mutation_variable_mean,
                   params.init_mutation_variable_stddev,
                   params.init_mutation_value_mean,
                   params.init_mutation_value_stddev,
                   params.init_kappa_improve_start,
                   params.init_kappa_improve_increase,
                   params.init_kappa_improve_stop);
    } else {
        fmt::print(" * Random solvers:\n"
                   "  - random: bernouilli with p=0.5\n");
    }
}